

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void utf8_suite::test_FC_80_80_80(void)

{
  char input [7];
  decoder_type decoder;
  undefined4 local_150;
  value local_14c;
  value_type local_148 [8];
  basic_decoder<char> local_140;
  
  local_148[4] = -0x80;
  local_148[5] = '\"';
  local_148[6] = '\0';
  local_148[0] = '\"';
  local_148[1] = -4;
  local_148[2] = -0x80;
  local_148[3] = -0x80;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<7ul>
            (&local_140,(value_type (*) [7])local_148);
  local_14c = local_140.current.code;
  local_150 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x880,"void utf8_suite::test_FC_80_80_80()",&local_14c,&local_150);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[6]>
            ("decoder.literal()","\"\\\"\\xFC\\x80\\x80\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x881,"void utf8_suite::test_FC_80_80_80()",&local_140.current.view,
             anon_var_dwarf_6ce4);
  return;
}

Assistant:

void test_FC_80_80_80()
{
    const char input[] = "\"\xFC\x80\x80\x80\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xFC\x80\x80\x80");
}